

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::RepeatedFieldHelper<8>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  bool *ptr;
  int i;
  int index;
  
  for (index = 0; index < *field; index = index + 1) {
    io::CodedOutputStream::WriteVarint32(output,md->tag);
    ptr = RepeatedField<bool>::Get((RepeatedField<bool> *)field,index);
    PrimitiveTypeHelper<8>::Serialize(ptr,output);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }